

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::write_zeros(raw_ostream *this,uint NumZeros)

{
  raw_ostream *prVar1;
  uint NumZeros_local;
  raw_ostream *this_local;
  
  prVar1 = write_padding<(char)0>(this,NumZeros);
  return prVar1;
}

Assistant:

raw_ostream &raw_ostream::write_zeros(unsigned NumZeros) {
  return write_padding<'\0'>(*this, NumZeros);
}